

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::PMJ02BNSampler::Get1D(PMJ02BNSampler *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  
  uVar4 = MixBits((long)*(int *)(Options + 4) ^
                  (long)this->dimension << 0x10 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30);
  iVar3 = PermutationElement(this->sampleIndex,this->samplesPerPixel,(uint32_t)uVar4);
  fVar5 = BlueNoise(this->dimension,(this->pixel).super_Tuple2<pbrt::Point2,_int>.x,
                    (this->pixel).super_Tuple2<pbrt::Point2,_int>.y);
  this->dimension = this->dimension + 1;
  auVar6._0_4_ = (fVar5 + (float)iVar3) / (float)this->samplesPerPixel;
  auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
  uVar1 = vcmpss_avx512f(auVar6,ZEXT416(0x3f800000),9);
  bVar2 = (bool)((byte)uVar1 & 1);
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                      ZEXT416((uint)bVar2 * (int)auVar6._0_4_ +
                              (uint)!bVar2 * (int)(auVar6._0_4_ + -1.0)));
  return auVar6._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);

        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        Float cpOffset = BlueNoise(dimension, pixel.x, pixel.y);
        Float u = (index + cpOffset) / samplesPerPixel;
        if (u >= 1)
            u -= 1;
        ++dimension;
        return std::min(u, OneMinusEpsilon);
    }